

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_31::ConcurrencyLimitingHttpClient::attachCounter
          (ConcurrencyLimitingHttpClient *this,Promise<kj::HttpClient::WebSocketResponse> *promise,
          ConnectionCounter *counter)

{
  ConnectionCounter *other;
  PromiseNode *extraout_RDX;
  Promise<kj::HttpClient::WebSocketResponse> PVar1;
  PropagateException local_28 [8];
  ConnectionCounter *local_20;
  ConnectionCounter *counter_local;
  Promise<kj::HttpClient::WebSocketResponse> *promise_local;
  
  local_20 = counter;
  counter_local = (ConnectionCounter *)promise;
  promise_local = (Promise<kj::HttpClient::WebSocketResponse> *)this;
  other = mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>(counter);
  ConnectionCounter::ConnectionCounter((ConnectionCounter *)local_28,other);
  Promise<kj::HttpClient::WebSocketResponse>::
  then<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::attachCounter(kj::Promise<kj::HttpClient::WebSocketResponse>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_,kj::_::PropagateException>
            ((Promise<kj::HttpClient::WebSocketResponse> *)this,(Type *)promise,local_28);
  (anonymous_namespace)::ConcurrencyLimitingHttpClient::
  attachCounter(kj::Promise<kj::HttpClient::WebSocketResponse>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)
  ::{lambda(kj::HttpClient::WebSocketResponse&&)#1}::~ConnectionCounter
            ((_lambda_kj__HttpClient__WebSocketResponse____1_ *)local_28);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpClient::WebSocketResponse>)PVar1.super_PromiseBase.node;
}

Assistant:

static kj::Promise<WebSocketResponse> attachCounter(kj::Promise<WebSocketResponse>&& promise,
                                                      ConnectionCounter&& counter) {
    return promise.then([counter = kj::mv(counter)](WebSocketResponse&& response) mutable {
      return WebSocketResponse {
        response.statusCode,
        response.statusText,
        response.headers,
        attachCounter(kj::mv(response.webSocketOrBody), kj::mv(counter))
      };
    });
  }